

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

void Excel::Parser::handleLabel(Record *record,size_t sheetIdx,IStorage *storage)

{
  RecordSubstream *this;
  BiffVersion in_R9D;
  int16_t column;
  int16_t row;
  wstring data;
  short local_5c;
  short local_5a;
  size_t local_58;
  wstring local_50;
  
  local_5a = 0;
  local_5c = 0;
  this = &record->m_stream;
  local_58 = sheetIdx;
  Stream::read<short>(&this->super_Stream,&local_5a,2);
  Stream::read<short>(&this->super_Stream,&local_5c,2);
  (*(record->m_stream).super_Stream._vptr_Stream[4])(this,2,1);
  loadString_abi_cxx11_
            (&local_50,(Excel *)this,(Stream *)&record->m_borders,
             (vector<int,_std::allocator<int>_> *)0x2,0x500,in_R9D);
  (*storage->_vptr_IStorage[6])(storage,local_58,(long)local_5a,(long)local_5c,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity * 4 + 4);
  }
  return;
}

Assistant:

inline void
Parser::handleLabel( Record & record, size_t sheetIdx, IStorage & storage )
{
	int16_t row = 0;
	int16_t column = 0;

	record.dataStream().read( row, 2 );
	record.dataStream().read( column, 2 );
	record.dataStream().seek( 2, Excel::Stream::FromCurrent );
	const auto data = loadString( record.dataStream(), record.borders(), 2, BOF::BIFF7 );

	storage.onCell( sheetIdx, row, column, data );
}